

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O1

int omac_imit_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  CMAC_CTX *pCVar7;
  
  puVar5 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  plVar6 = (long *)EVP_MD_CTX_get0_md_data(from);
  iVar4 = 0;
  if (puVar5 != (undefined8 *)0x0 && plVar6 != (long *)0x0) {
    puVar5[1] = plVar6[1];
    puVar5[2] = plVar6[2];
    *(int *)(puVar5 + 3) = (int)plVar6[3];
    uVar1 = *(undefined8 *)((long)plVar6 + 0x1c);
    uVar2 = *(undefined8 *)((long)plVar6 + 0x24);
    uVar3 = *(undefined8 *)((long)plVar6 + 0x34);
    *(undefined8 *)((long)puVar5 + 0x2c) = *(undefined8 *)((long)plVar6 + 0x2c);
    *(undefined8 *)((long)puVar5 + 0x34) = uVar3;
    *(undefined8 *)((long)puVar5 + 0x1c) = uVar1;
    *(undefined8 *)((long)puVar5 + 0x24) = uVar2;
    pCVar7 = (CMAC_CTX *)*puVar5;
    if ((CMAC_CTX *)*plVar6 != (CMAC_CTX *)0x0) {
      if (pCVar7 == (CMAC_CTX *)*plVar6) {
        pCVar7 = CMAC_CTX_new();
        *puVar5 = pCVar7;
      }
      iVar4 = CMAC_CTX_copy((CMAC_CTX *)*puVar5,(CMAC_CTX *)*plVar6);
      return iVar4;
    }
    iVar4 = 1;
    if (pCVar7 != (CMAC_CTX *)0x0) {
      CMAC_CTX_free(pCVar7);
      *puVar5 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int omac_imit_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    OMAC_CTX *c_to = EVP_MD_CTX_md_data(to);
    const OMAC_CTX *c_from = EVP_MD_CTX_md_data(from);

    if (c_from && c_to) {
        c_to->dgst_size = c_from->dgst_size;
        c_to->cipher_name = c_from->cipher_name;
        c_to->key_set = c_from->key_set;
        memcpy(c_to->key, c_from->key, 32);
    } else {
        return 0;
    }
    if (!c_from->cmac_ctx) {
        if (c_to->cmac_ctx) {
            CMAC_CTX_free(c_to->cmac_ctx);
            c_to->cmac_ctx = NULL;
        }
        return 1;
    }
    if (c_to->cmac_ctx == c_from->cmac_ctx) {
        c_to->cmac_ctx = CMAC_CTX_new();
    }
    return CMAC_CTX_copy(c_to->cmac_ctx, c_from->cmac_ctx);
}